

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void __thiscall PDA::Exception::Exception::Exception(Exception *this,wstring *what)

{
  this->_vptr_Exception = (_func_int **)&PTR_what_abi_cxx11__001458a8;
  std::__cxx11::wstring::wstring((wstring *)&this->m_information,(wstring *)what);
  return;
}

Assistant:

Exception::Exception(const std::wstring &what) : m_information(what)
{

}